

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netbase.cpp
# Opt level: O1

bool GetProxy(Network net,Proxy *proxyInfoOut)

{
  uint32_t uVar1;
  bool bVar2;
  bool bVar3;
  long in_FS_OFFSET;
  UniqueLock<GlobalMutex> criticalblock6;
  unique_lock<std::mutex> local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (NET_INTERNAL < net) {
    __assert_fail("net >= 0 && net < NET_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/netbase.cpp"
                  ,0x2b2,"bool GetProxy(enum Network, Proxy &)");
  }
  local_30._M_device = (mutex_type *)&g_proxyinfo_mutex;
  local_30._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_30);
  if (proxyInfo[net].m_is_unix_socket == true) {
    bVar3 = IsUnixSocketPath(&proxyInfo[net].m_unix_socket_path);
  }
  else {
    bVar3 = CNetAddr::IsValid((CNetAddr *)(proxyInfo + net));
  }
  if (bVar3 != false) {
    prevector<16U,_unsigned_char,_unsigned_int,_int>::operator=
              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)proxyInfoOut,
               (prevector<16U,_unsigned_char,_unsigned_int,_int> *)(proxyInfo + net));
    uVar1 = proxyInfo[net].proxy.super_CNetAddr.m_scope_id;
    (proxyInfoOut->proxy).super_CNetAddr.m_net = proxyInfo[net].proxy.super_CNetAddr.m_net;
    (proxyInfoOut->proxy).super_CNetAddr.m_scope_id = uVar1;
    (proxyInfoOut->proxy).port = proxyInfo[net].proxy.port;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (&proxyInfoOut->m_unix_socket_path,&proxyInfo[net].m_unix_socket_path);
    bVar2 = proxyInfo[net].m_randomize_credentials;
    proxyInfoOut->m_is_unix_socket = proxyInfo[net].m_is_unix_socket;
    proxyInfoOut->m_randomize_credentials = bVar2;
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool GetProxy(enum Network net, Proxy &proxyInfoOut) {
    assert(net >= 0 && net < NET_MAX);
    LOCK(g_proxyinfo_mutex);
    if (!proxyInfo[net].IsValid())
        return false;
    proxyInfoOut = proxyInfo[net];
    return true;
}